

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseLast(ExtensionSet *this,int number)

{
  Extension *pEVar1;
  MessageLite *pMVar2;
  Extension *extension;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  LogMessage *in_stack_fffffffffffffee0;
  LogLevel in_stack_fffffffffffffeec;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  ExtensionSet *in_stack_fffffffffffffef8;
  
  pEVar1 = FindOrNull(in_stack_fffffffffffffef8,in_stack_fffffffffffffef4);
  if (pEVar1 == (Extension *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
               in_stack_fffffffffffffeec,(char *)in_stack_fffffffffffffee0,in_stack_fffffffffffffedc
              );
    LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogMessage::operator<<
              (in_stack_fffffffffffffee0,
               (char *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogFinisher::operator=
              ((LogFinisher *)in_stack_fffffffffffffee0,
               (LogMessage *)CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    LogMessage::~LogMessage((LogMessage *)0x4aad04);
  }
  pMVar2 = RepeatedPtrField<google::protobuf::MessageLite>::ReleaseLast
                     ((RepeatedPtrField<google::protobuf::MessageLite> *)0x4aaed0);
  return pMVar2;
}

Assistant:

MessageLite* ExtensionSet::ReleaseLast(int number) {
  Extension* extension = FindOrNull(number);
  GOOGLE_CHECK(extension != NULL) << "Index out-of-bounds (field is empty).";
  GOOGLE_DCHECK(extension->is_repeated);
  GOOGLE_DCHECK(cpp_type(extension->type) == WireFormatLite::CPPTYPE_MESSAGE);
  return extension->repeated_message_value->ReleaseLast();
}